

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mode_setting.cpp
# Opt level: O3

spv_result_t spvtools::val::ModeSettingPass(ValidationState_t *_,Instruction *inst)

{
  _Rb_tree_node_base *p_Var1;
  ushort uVar2;
  undefined8 uVar3;
  pointer pIVar4;
  bool bVar5;
  uint16_t uVar6;
  _Head_base<2UL,_unsigned_int,_false> id;
  ExecutionModel EVar7;
  uint uVar8;
  int32_t iVar9;
  MemoryModel MVar10;
  AddressingModel AVar11;
  Decoration DVar12;
  BuiltIn BVar13;
  ExecutionMode EVar14;
  Instruction *pIVar15;
  Instruction *pIVar16;
  const_iterator cVar17;
  _Rb_tree_node_base *p_Var18;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var19;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar20;
  _Base_ptr p_Var21;
  difference_type dVar22;
  _Rb_tree_node_base *p_Var23;
  size_type sVar24;
  long lVar25;
  long lVar26;
  spv_result_t sVar27;
  char *pcVar28;
  undefined1 *puVar29;
  size_t index;
  _Rb_tree_header *p_Var30;
  difference_type __n;
  ulong uVar31;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_> *this;
  Instruction *i;
  pointer this_00;
  uint entry_point_id;
  string local_250;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *local_230;
  _Head_base<2UL,_unsigned_int,_false> local_228;
  undefined4 uStack_224;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [5];
  char local_203;
  spv_result_t local_38;
  
  uVar2 = (inst->inst_).opcode;
  if (uVar2 < 0x10) {
    if (uVar2 == 0xe) {
      MVar10 = ValidationState_t::memory_model(_);
      if ((MVar10 == MemoryModelVulkan) ||
         (bVar5 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityVulkanMemoryModel), !bVar5)) {
        bVar5 = spvIsOpenCLEnv(_->context_->target_env);
        if (!bVar5) {
LAB_001e21ef:
          bVar5 = spvIsVulkanEnv(_->context_->target_env);
          if (!bVar5) {
            return SPV_SUCCESS;
          }
          AVar11 = ValidationState_t::addressing_model(_);
          if (AVar11 == AddressingModelLogical) {
            return SPV_SUCCESS;
          }
          AVar11 = ValidationState_t::addressing_model(_);
          if (AVar11 == AddressingModelPhysicalStorageBuffer64) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_250,_,0x121b,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     (char *)CONCAT44(local_250._M_dataplus._M_p._4_4_,
                                      local_250._M_dataplus._M_p._0_4_),local_250._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,
                     "Addressing model must be Logical or PhysicalStorageBuffer64 ",0x3c);
          pcVar28 = "in the Vulkan environment.";
          lVar25 = 0x1a;
          goto LAB_001e22dd;
        }
        AVar11 = ValidationState_t::addressing_model(_);
        if ((AVar11 == AddressingModelPhysical32) ||
           (AVar11 = ValidationState_t::addressing_model(_), AVar11 == AddressingModelPhysical64)) {
          MVar10 = ValidationState_t::memory_model(_);
          if (MVar10 == MemoryModelOpenCL) goto LAB_001e21ef;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar28 = "Memory model must be OpenCL in the OpenCL environment.";
          lVar25 = 0x36;
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Addressing model must be Physical32 or Physical64 ",0x32)
          ;
          pcVar28 = "in the OpenCL environment.";
          lVar25 = 0x1a;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar28 = 
        "VulkanMemoryModelKHR capability must only be specified if the VulkanKHR memory model is used."
        ;
        lVar25 = 0x5d;
      }
      goto LAB_001e2e29;
    }
    if (uVar2 != 0xf) {
      return SPV_SUCCESS;
    }
    id._M_head_impl = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar15 = ValidationState_t::FindDef(_,id._M_head_impl);
    if ((pIVar15 == (Instruction *)0x0) || ((pIVar15->inst_).opcode != 0x36)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpEntryPoint Entry Point <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_(&local_250,_,id._M_head_impl);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 (char *)CONCAT44(local_250._M_dataplus._M_p._4_4_,local_250._M_dataplus._M_p._0_4_)
                 ,local_250._M_string_length);
      pcVar28 = " is not a function.";
      lVar25 = 0x13;
      goto LAB_001e22dd;
    }
    EVar7 = Instruction::GetOperandAs<spv::ExecutionModel>(inst,0);
    if (EVar7 == ExecutionModelKernel) {
LAB_001e1ebe:
      pIVar15 = ValidationState_t::FindDef(_,(pIVar15->inst_).type_id);
      if ((pIVar15 != (Instruction *)0x0) && ((pIVar15->inst_).opcode == 0x13)) {
        local_208._0_4_ = id._M_head_impl;
        cVar17 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(_->entry_point_to_execution_modes_)._M_h,(key_type_conflict *)local_208);
        this = (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                *)((long)cVar17.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                         ._M_cur + 0x10);
        bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if (bVar5) {
          if ((int)EVar7 < 4) {
            if (EVar7 - ExecutionModelTessellationControl < 2) {
              if (cVar17.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                  ._M_cur != (__node_type *)0x0) {
                p_Var23 = *(_Rb_tree_node_base **)
                           ((long)cVar17.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                  ._M_cur + 0x28);
                p_Var1 = (_Rb_tree_node_base *)
                         ((long)cVar17.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                ._M_cur + 0x18);
                if (p_Var23 != p_Var1) {
                  uVar31 = 0;
                  p_Var18 = p_Var23;
                  local_230 = this;
                  do {
                    uVar31 = uVar31 + (p_Var18[1]._M_color - _S_black < 3);
                    p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
                  } while (p_Var18 != p_Var1);
                  if (uVar31 < 2) {
                    lVar25 = 0;
                    p_Var18 = p_Var23;
                    do {
                      if ((p_Var18[1]._M_color < 0x1a) &&
                         ((0x3400000U >> (p_Var18[1]._M_color & 0x1f) & 1) != 0)) {
                        lVar25 = lVar25 + 1;
                      }
                      p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
                    } while (p_Var18 != p_Var1);
                    if (lVar25 < 2) {
                      uVar31 = 0;
                      do {
                        uVar31 = uVar31 + ((p_Var23[1]._M_color & ~_S_black) == 4);
                        p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
                      } while (p_Var23 != p_Var1);
                      this = local_230;
                      if (uVar31 < 2) goto LAB_001e3126;
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar28 = 
                      "Tessellation execution model entry points can specify at most one of VertexOrderCw or VertexOrderCcw execution modes."
                      ;
                      lVar25 = 0x75;
                    }
                    else {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar28 = 
                      "Tessellation execution model entry points can specify at most one of Triangles, Quads or Isolines execution modes."
                      ;
                      lVar25 = 0x72;
                    }
                  }
                  else {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar28 = 
                    "Tessellation execution model entry points can specify at most one of SpacingEqual, SpacingFractionalOdd or SpacingFractionalEven execution modes."
                    ;
                    lVar25 = 0x91;
                  }
                  goto LAB_001e2e29;
                }
              }
            }
            else if (EVar7 == ExecutionModelGeometry) {
              local_230 = this;
              if (cVar17.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                  ._M_cur != (__node_type *)0x0) {
                p_Var23 = *(_Rb_tree_node_base **)
                           ((long)cVar17.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                  ._M_cur + 0x28);
                p_Var1 = (_Rb_tree_node_base *)
                         ((long)cVar17.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                ._M_cur + 0x18);
                if (p_Var23 != p_Var1) {
                  lVar25 = 0;
                  p_Var18 = p_Var23;
                  do {
                    lVar25 = lVar25 + (ulong)(p_Var18[1]._M_color - 0x13 < 5);
                    p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
                  } while (p_Var18 != p_Var1);
                  if (lVar25 == 1) {
                    lVar25 = 0;
                    do {
                      lVar25 = lVar25 + (ulong)(p_Var23[1]._M_color - 0x1b < 3);
                      p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
                    } while (p_Var23 != p_Var1);
                    this = local_230;
                    if (lVar25 != 1) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar28 = 
                      "Geometry execution model entry points must specify exactly one of OutputPoints, OutputLineStrip or OutputTriangleStrip execution modes."
                      ;
                      lVar25 = 0x87;
                      goto LAB_001e2e29;
                    }
                    goto LAB_001e3126;
                  }
                }
              }
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar28 = 
              "Geometry execution model entry points must specify exactly one of InputPoints, InputLines, InputLinesAdjacency, Triangles or InputTrianglesAdjacency execution modes."
              ;
              lVar25 = 0xa5;
              goto LAB_001e2e29;
            }
          }
          else {
            if (EVar7 == ExecutionModelMeshEXT) {
              if (cVar17.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                  ._M_cur != (__node_type *)0x0) {
                uVar3 = *(undefined8 *)
                         ((long)cVar17.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                ._M_cur + 0x28);
                dVar22 = std::
                         count_if<std::_Rb_tree_const_iterator<spv::ExecutionMode>,spvtools::val::(anonymous_namespace)::ValidateEntryPoint(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__9>
                                   (uVar3,(long)cVar17.
                                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                                ._M_cur + 0x18);
                if (dVar22 == 1) {
                  dVar22 = std::
                           count_if<std::_Rb_tree_const_iterator<spv::ExecutionMode>,spvtools::val::(anonymous_namespace)::ValidateEntryPoint(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__10>
                                     (uVar3,(long)cVar17.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                                  ._M_cur + 0x18);
                  if (dVar22 != 2) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar28 = 
                    "MeshEXT execution model entry points must specify both OutputPrimitivesEXT and OutputVertices Execution Modes."
                    ;
                    lVar25 = 0x6e;
                    goto LAB_001e2e29;
                  }
                  goto LAB_001e3126;
                }
              }
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar28 = 
              "MeshEXT execution model entry points must specify exactly one of OutputPoints, OutputLinesEXT, or OutputTrianglesEXT Execution Modes."
              ;
              lVar25 = 0x85;
              goto LAB_001e2e29;
            }
            if (EVar7 == ExecutionModelFragment) {
              if (cVar17.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
LAB_001e3004:
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar28 = 
                "Fragment execution model entry points require either an OriginUpperLeft or OriginLowerLeft execution mode."
                ;
LAB_001e298c:
                lVar25 = 0x6a;
              }
              else {
                local_208._0_4_ = 7;
                sVar24 = std::
                         set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                         ::count(this,(key_type *)local_208);
                if (sVar24 != 0) {
                  local_250._M_dataplus._M_p._0_4_ = 8;
                  sVar24 = std::
                           set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                           ::count(this,(key_type *)&local_250);
                  if (sVar24 != 0) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar28 = 
                    "Fragment execution model entry points can only specify one of OriginUpperLeft or OriginLowerLeft execution modes."
                    ;
                    lVar25 = 0x71;
                    goto LAB_001e2e29;
                  }
                }
                local_208._0_4_ = 7;
                sVar24 = std::
                         set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                         ::count(this,(key_type *)local_208);
                if (sVar24 == 0) {
                  local_250._M_dataplus._M_p._0_4_ = 8;
                  sVar24 = std::
                           set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                           ::count(this,(key_type *)&local_250);
                  if (sVar24 == 0) goto LAB_001e3004;
                }
                p_Var23 = *(_Rb_tree_node_base **)
                           ((long)cVar17.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                  ._M_cur + 0x28);
                p_Var1 = (_Rb_tree_node_base *)
                         ((long)cVar17.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                ._M_cur + 0x18);
                if (p_Var23 == p_Var1) goto LAB_001e3126;
                uVar31 = 0;
                p_Var18 = p_Var23;
                local_230 = this;
                do {
                  uVar31 = uVar31 + (p_Var18[1]._M_color - 0xe < 3);
                  p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
                } while (p_Var18 != p_Var1);
                if (uVar31 < 2) {
                  uVar31 = 0;
                  p_Var18 = p_Var23;
                  do {
                    uVar31 = uVar31 + (p_Var18[1]._M_color - 0x14f6 < 6);
                    p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
                  } while (p_Var18 != p_Var1);
                  if (uVar31 < 2) {
                    uVar31 = 0;
                    p_Var18 = p_Var23;
                    do {
                      uVar31 = uVar31 + (p_Var18[1]._M_color - 0x13d7 < 3);
                      p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
                    } while (p_Var18 != p_Var1);
                    if (uVar31 < 2) {
                      uVar31 = 0;
                      do {
                        uVar31 = uVar31 + (p_Var23[1]._M_color - 0x13da < 3);
                        p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
                      } while (p_Var23 != p_Var1);
                      this = local_230;
                      if (uVar31 < 2) goto LAB_001e3126;
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar28 = 
                      "Fragment execution model entry points can specify at most one of StencilRefUnchangedBackAMD, StencilRefLessBackAMD or StencilRefGreaterBackAMD execution modes."
                      ;
                      lVar25 = 0x9f;
                    }
                    else {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar28 = 
                      "Fragment execution model entry points can specify at most one of StencilRefUnchangedFrontAMD, StencilRefLessFrontAMD or StencilRefGreaterFrontAMD execution modes."
                      ;
                      lVar25 = 0xa2;
                    }
                  }
                  else {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    pcVar28 = 
                    "Fragment execution model entry points can specify at most one fragment shader interlock execution mode."
                    ;
                    lVar25 = 0x67;
                  }
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar28 = 
                  "Fragment execution model entry points can specify at most one of DepthGreater, DepthLess or DepthUnchanged execution modes."
                  ;
                  lVar25 = 0x7b;
                }
              }
              goto LAB_001e2e29;
            }
          }
        }
LAB_001e3126:
        bVar5 = spvIsVulkanEnv(_->context_->target_env);
        if (EVar7 != ExecutionModelGLCompute) {
          return SPV_SUCCESS;
        }
        if (!bVar5) {
          return SPV_SUCCESS;
        }
        if (cVar17.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          local_208._0_4_ = 0x11;
          sVar24 = std::
                   set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                   ::count(this,(key_type *)local_208);
          if (sVar24 != 0) {
            return SPV_SUCCESS;
          }
        }
        pIVar4 = (_->ordered_instructions_).
                 super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_00 = (_->ordered_instructions_).
                       super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 != pIVar4;
            this_00 = this_00 + 1) {
          uVar6 = (this_00->inst_).opcode;
          if (uVar6 == 0x47) {
            if (((0x20 < (ulong)((long)(this_00->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_00->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start)) &&
                (DVar12 = Instruction::GetOperandAs<spv::Decoration>(this_00,1), DVar12 == BuiltIn))
               && (BVar13 = Instruction::GetOperandAs<spv::BuiltIn>(this_00,2),
                  BVar13 == BuiltInWorkgroupSize)) {
              return SPV_SUCCESS;
            }
            uVar6 = (this_00->inst_).opcode;
          }
          if ((uVar6 == 0x14b) &&
             (EVar14 = Instruction::GetOperandAs<spv::ExecutionMode>(this_00,1),
             EVar14 == ExecutionModeLocalSizeId)) {
            return SPV_SUCCESS;
          }
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_250,_,0x191a,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_250._M_dataplus._M_p._4_4_,
                                    local_250._M_dataplus._M_p._0_4_),local_250._M_string_length);
        pcVar28 = 
        "In the Vulkan environment, GLCompute execution model entry points require either the LocalSize or LocalSizeId execution mode or an object decorated with WorkgroupSize must be specified."
        ;
        lVar25 = 0xb9;
        goto LAB_001e22dd;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_250,_,0x1219,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 (char *)CONCAT44(local_250._M_dataplus._M_p._4_4_,local_250._M_dataplus._M_p._0_4_)
                 ,local_250._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpEntryPoint Entry Point <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_228,_,id._M_head_impl);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)CONCAT44(uStack_224,local_228._M_head_impl),local_220)
      ;
      pcVar28 = "s function return type is not void.";
      lVar25 = 0x23;
    }
    else {
      uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar15,3);
      pIVar16 = ValidationState_t::FindDef(_,uVar8);
      if ((pIVar16 != (Instruction *)0x0) &&
         ((long)(pIVar16->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pIVar16->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start == 0xc)) goto LAB_001e1ebe;
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_250,_,0x1219,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,
                 (char *)CONCAT44(local_250._M_dataplus._M_p._4_4_,local_250._M_dataplus._M_p._0_4_)
                 ,local_250._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpEntryPoint Entry Point <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_228,_,id._M_head_impl);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)CONCAT44(uStack_224,local_228._M_head_impl),local_220)
      ;
      pcVar28 = "s function parameter count is not zero.";
      lVar25 = 0x27;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar28,lVar25);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_224,local_228._M_head_impl) != &local_218) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_224,local_228._M_head_impl),
                      local_218._M_allocated_capacity + 1);
    }
    puVar29 = (undefined1 *)
              CONCAT44(local_250._M_dataplus._M_p._4_4_,local_250._M_dataplus._M_p._0_4_);
    sVar27 = local_38;
    goto LAB_001e22f4;
  }
  if ((uVar2 != 0x10) && (uVar2 != 0x14b)) {
    return SPV_SUCCESS;
  }
  local_228._M_head_impl = Instruction::GetOperandAs<unsigned_int>(inst,0);
  _Var19 = std::
           __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                     ((_->entry_points_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (_->entry_points_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (_Var19._M_current ==
      (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"OpExecutionMode Entry Point <id> ",0x21);
    ValidationState_t::getIdName_abi_cxx11_(&local_250,_,local_228._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               (char *)CONCAT44(local_250._M_dataplus._M_p._4_4_,local_250._M_dataplus._M_p._0_4_),
               local_250._M_string_length);
    pcVar28 = " is not the Entry Point operand of an OpEntryPoint.";
    lVar25 = 0x33;
    goto LAB_001e22dd;
  }
  EVar14 = Instruction::GetOperandAs<spv::ExecutionMode>(inst,1);
  if ((inst->inst_).opcode != 0x14b) {
    if ((2 < EVar14 - ExecutionModeSubgroupsPerWorkgroupId) &&
       (EVar14 != ExecutionModeFPFastMathDefault)) goto LAB_001e234d;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar28 = 
    "OpExecutionMode is only valid when the Mode operand is an execution mode that takes no Extra Operands, or takes Extra Operands that are not id operands."
    ;
    lVar25 = 0x98;
    goto LAB_001e2e29;
  }
  if (((2 < EVar14 - ExecutionModeSubgroupsPerWorkgroupId) &&
      (EVar14 != ExecutionModeFPFastMathDefault)) &&
     (EVar14 != ExecutionModeMaximumRegistersIdINTEL)) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    pcVar28 = 
    "OpExecutionModeId is only valid when the Mode operand is an execution mode that takes Extra Operands that are id operands."
    ;
    lVar25 = 0x7a;
    goto LAB_001e2e29;
  }
  uVar31 = (long)(inst->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(inst->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  if (2 < uVar31) {
    index = 2;
    do {
      uVar8 = Instruction::GetOperandAs<unsigned_int>(inst,index);
      pIVar15 = ValidationState_t::FindDef(_,uVar8);
      if (EVar14 - ExecutionModeSubgroupsPerWorkgroupId < 3) {
        iVar9 = spvOpcodeIsConstant((uint)(pIVar15->inst_).opcode);
        if (iVar9 == 0) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar28 = "For OpExecutionModeId all Extra Operand ids must be constant instructions.";
          lVar25 = 0x4a;
          goto LAB_001e2e29;
        }
      }
      else if (EVar14 == ExecutionModeFPFastMathDefault) {
        if (index == 2) {
          bVar5 = ValidationState_t::IsFloatScalarType(_,uVar8);
          if (!bVar5) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            pcVar28 = "The Target Type operand must be a floating-point scalar type";
            lVar25 = 0x3c;
            goto LAB_001e2e29;
          }
        }
        else {
          ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar8);
          if ((local_203 != '\x01') || (local_208[4] == false)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            pcVar28 = "The Fast Math Default operand must be a non-specialization constant";
            lVar25 = 0x43;
            goto LAB_001e2e29;
          }
          if (0x7ffff < (uint)local_208._0_4_) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            pcVar28 = "The Fast Math Default operand is an invalid bitmask value";
            lVar25 = 0x39;
            goto LAB_001e2e29;
          }
          if ((local_208._0_4_ & 0x10) != 0) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            pcVar28 = "The Fast Math Default operand must not include Fast";
            lVar25 = 0x33;
            goto LAB_001e2e29;
          }
          if ((~local_208._0_4_ & 0x30000) != 0 && 0x3ffff < (uint)local_208._0_4_) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            pcVar28 = 
            "The Fast Math Default operand must include AllowContract and AllowReassoc when AllowTransform is specified"
            ;
            goto LAB_001e298c;
          }
        }
      }
      index = index + 1;
    } while (uVar31 != index);
  }
LAB_001e234d:
  psVar20 = ValidationState_t::GetExecutionModels(_,local_228._M_head_impl);
  if (0x13d6 < (int)EVar14) {
    if ((int)EVar14 < 0x1495) {
      if (5 < EVar14 - ExecutionModeStencilRefUnchangedFrontAMD) {
        if (EVar14 == ExecutionModeQuadDerivativesKHR) {
          p_Var21 = (psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var30 = &(psVar20->_M_t)._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var21 == p_Var30) goto LAB_001e2d45;
          do {
            if ((p_Var21[1]._M_color & ~_S_black) != 4) {
              if ((_Rb_tree_header *)p_Var21 != p_Var30) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pcVar28 = 
                "Execution mode can only be used with the Fragment or GLCompute execution model.";
                lVar25 = 0x4f;
                goto LAB_001e2e29;
              }
              break;
            }
            p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
          } while ((_Rb_tree_header *)p_Var21 != p_Var30);
        }
        else if (EVar14 == ExecutionModeRequireFullQuadsKHR) goto switchD_001e2387_caseD_6;
        goto switchD_001e2387_caseD_b;
      }
    }
    else if (5 < EVar14 - ExecutionModePixelInterlockOrderedEXT) {
      if ((EVar14 - ExecutionModeOutputLinesEXT < 0x1e) &&
         ((0x20000003U >> (EVar14 - ExecutionModeOutputLinesEXT & 0x1f) & 1) != 0)) {
        bVar5 = std::
                all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__5>
                          ((psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                           &(psVar20->_M_t)._M_impl.super__Rb_tree_header);
        if (!bVar5) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar28 = "Execution mode can only be used with the MeshEXT or MeshNV execution model.";
          goto LAB_001e242f;
        }
        goto LAB_001e2d45;
      }
      goto switchD_001e2387_caseD_b;
    }
switchD_001e2387_caseD_6:
    p_Var21 = (psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var30 = &(psVar20->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var21 != p_Var30) {
      do {
        if (p_Var21[1]._M_color != 4) {
          if ((_Rb_tree_header *)p_Var21 != p_Var30) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar28 = "Execution mode can only be used with the Fragment execution model.";
            goto LAB_001e27a9;
          }
          break;
        }
        p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
      } while ((_Rb_tree_header *)p_Var21 != p_Var30);
      goto switchD_001e2387_caseD_b;
    }
    goto LAB_001e2d45;
  }
  switch(EVar14) {
  case ExecutionModeInvocations:
  case ExecutionModeInputPoints:
  case ExecutionModeInputLines:
  case ExecutionModeInputLinesAdjacency:
  case ExecutionModeInputTrianglesAdjacency:
  case ExecutionModeOutputLineStrip:
  case ExecutionModeOutputTriangleStrip:
    p_Var21 = (psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var30 = &(psVar20->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var21 != p_Var30) {
      do {
        if (p_Var21[1]._M_color != 3) {
          if ((_Rb_tree_header *)p_Var21 != p_Var30) goto LAB_001e278a;
          break;
        }
        p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
      } while ((_Rb_tree_header *)p_Var21 != p_Var30);
      break;
    }
    goto LAB_001e2d45;
  case ExecutionModeSpacingEqual:
  case ExecutionModeSpacingFractionalEven:
  case ExecutionModeSpacingFractionalOdd:
  case ExecutionModeVertexOrderCw:
  case ExecutionModeVertexOrderCcw:
  case ExecutionModePointMode:
  case ExecutionModeQuads:
  case ExecutionModeIsolines:
    p_Var21 = (psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var30 = &(psVar20->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var21 == p_Var30) goto LAB_001e2d45;
    do {
      if (p_Var21[1]._M_color - 3 < 0xfffffffe) {
        if ((_Rb_tree_header *)p_Var21 != p_Var30) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar28 = "Execution mode can only be used with a tessellation execution model.";
          lVar25 = 0x44;
          goto LAB_001e2e29;
        }
        break;
      }
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
    } while ((_Rb_tree_header *)p_Var21 != p_Var30);
    break;
  case ExecutionModePixelCenterInteger:
  case ExecutionModeOriginUpperLeft:
  case ExecutionModeOriginLowerLeft:
  case EarlyFragmentTests:
  case DepthReplacing:
  case DepthGreater:
  case DepthLess:
  case DepthUnchanged:
    goto switchD_001e2387_caseD_6;
  case ExecutionModeXfb:
  case DepthReplacing|ExecutionModeSpacingEqual:
  case 0x20:
  case ExecutionModeInitializer:
  case ExecutionModeFinalizer:
  case ExecutionModeSubgroupSize:
  case ExecutionModeSubgroupsPerWorkgroup:
  case ExecutionModeSubgroupsPerWorkgroupId:
    break;
  case ExecutionModeLocalSize:
  case ExecutionModeLocalSizeId:
    if (((EVar14 == ExecutionModeLocalSizeId) && ((_->features_).env_allow_localsizeid == false)) &&
       (_->options_->allow_localsizeid == false)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar28 = "LocalSizeId mode is not allowed by the current environment.";
      lVar25 = 0x3b;
    }
    else {
      bVar5 = std::
              all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__9>
                        ((psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<spv::ExecutionModel>)
                         &(psVar20->_M_t)._M_impl.super__Rb_tree_header,(anon_class_8_1_54a397ff)_);
      if (bVar5) goto LAB_001e2d45;
      bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityMeshShadingNV);
      if ((bVar5) ||
         (bVar5 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityMeshShadingEXT), bVar5)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar28 = 
        "Execution mode can only be used with a Kernel, GLCompute, MeshNV, MeshEXT, TaskNV or TaskEXT execution model."
        ;
        lVar25 = 0x6d;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar28 = "Execution mode can only be used with a Kernel or GLCompute execution model.";
LAB_001e242f:
        lVar25 = 0x4b;
      }
    }
    goto LAB_001e2e29;
  case ExecutionModeLocalSizeHint:
  case ExecutionModeVecTypeHint:
  case ContractionOff:
  case ExecutionModeLocalSizeHintId:
    p_Var21 = (psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var30 = &(psVar20->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var21 == p_Var30) goto LAB_001e2d45;
    do {
      if (p_Var21[1]._M_color != 6) {
        if ((_Rb_tree_header *)p_Var21 != p_Var30) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar28 = "Execution mode can only be used with the Kernel execution model.";
          lVar25 = 0x40;
          goto LAB_001e2e29;
        }
        break;
      }
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
    } while ((_Rb_tree_header *)p_Var21 != p_Var30);
    break;
  case ExecutionModeTriangles:
    p_Var21 = (psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var30 = &(psVar20->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var21 == p_Var30) goto LAB_001e2d45;
    do {
      if (p_Var21[1]._M_color - 4 < 0xfffffffd) {
        if ((_Rb_tree_header *)p_Var21 != p_Var30) goto LAB_001e2c77;
        break;
      }
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
    } while ((_Rb_tree_header *)p_Var21 != p_Var30);
    break;
  case ExecutionModeOutputVertices:
    bVar5 = std::
            all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__4>
                      ((psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<spv::ExecutionModel>)
                       &(psVar20->_M_t)._M_impl.super__Rb_tree_header,(anon_class_8_1_54a397ff)_);
    if (bVar5) goto LAB_001e2d45;
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityMeshShadingNV);
    if ((bVar5) ||
       (bVar5 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityMeshShadingEXT), bVar5)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar28 = 
      "Execution mode can only be used with a Geometry, tessellation, MeshNV or MeshEXT execution model."
      ;
      lVar25 = 0x61;
    }
    else {
LAB_001e2c77:
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar28 = "Execution mode can only be used with a Geometry or tessellation execution model.";
      lVar25 = 0x50;
    }
    goto LAB_001e2e29;
  case ExecutionModeOutputPoints:
    bVar5 = std::
            all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__1>
                      ((psVar20->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<spv::ExecutionModel>)
                       &(psVar20->_M_t)._M_impl.super__Rb_tree_header,(anon_class_8_1_54a397ff)_);
    if (bVar5) goto LAB_001e2d45;
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityMeshShadingNV);
    if ((bVar5) ||
       (bVar5 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityMeshShadingEXT), bVar5)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar28 = 
      "Execution mode can only be used with the Geometry MeshNV or MeshEXT execution model.";
      lVar25 = 0x54;
    }
    else {
LAB_001e278a:
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar28 = "Execution mode can only be used with the Geometry execution model.";
LAB_001e27a9:
      lVar25 = 0x42;
    }
    goto LAB_001e2e29;
  default:
    if ((EVar14 - ExecutionModeNonCoherentColorAttachmentReadEXT < 3) ||
       (EVar14 == EarlyAndLateFragmentTestsAMD)) goto switchD_001e2387_caseD_6;
  }
switchD_001e2387_caseD_b:
  if (EVar14 == ExecutionModeFPFastMathDefault) {
    local_208._0_4_ = local_228._M_head_impl;
    cVar17 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(_->entry_point_to_execution_modes_)._M_h,(key_type_conflict *)local_208);
    if (cVar17.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      lVar25 = *(long *)((long)cVar17.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                               ._M_cur + 0x20);
      if (lVar25 == 0) {
LAB_001e2d00:
        local_208._0_4_ = 0x116d;
        sVar24 = std::
                 set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 ::count((set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                          *)((long)cVar17.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                                   ._M_cur + 0x10),(key_type *)local_208);
        if (sVar24 == 0) goto LAB_001e2d45;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar28 = 
        "FPFastMathDefault and SignedZeroInfNanPreserve execution modes cannot be applied to the same entry point"
        ;
        lVar25 = 0x68;
      }
      else {
        lVar26 = (long)cVar17.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                       ._M_cur + 0x18;
        do {
          bVar5 = *(uint *)(lVar25 + 0x20) < 0x1f;
          if (!bVar5) {
            lVar26 = lVar25;
          }
          lVar25 = *(long *)(lVar25 + 0x10 + (ulong)bVar5 * 8);
        } while (lVar25 != 0);
        if ((lVar26 == (long)cVar17.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_false>
                             ._M_cur + 0x18) || (0x1f < *(uint *)(lVar26 + 0x20)))
        goto LAB_001e2d00;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar28 = 
        "FPFastMathDefault and ContractionOff execution modes cannot be applied to the same entry point"
        ;
        lVar25 = 0x5e;
      }
LAB_001e2e29:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar28,lVar25);
      sVar27 = local_38;
      goto LAB_001e2e3b;
    }
  }
LAB_001e2d45:
  bVar5 = spvIsVulkanEnv(_->context_->target_env);
  if (!bVar5) {
    return SPV_SUCCESS;
  }
  if (EVar14 == ExecutionModePixelCenterInteger) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_250,_,0x122e,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               (char *)CONCAT44(local_250._M_dataplus._M_p._4_4_,local_250._M_dataplus._M_p._0_4_),
               local_250._M_string_length);
    pcVar28 = "In the Vulkan environment, the PixelCenterInteger execution mode must not be used.";
    lVar25 = 0x52;
  }
  else {
    if (EVar14 != ExecutionModeOriginLowerLeft) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_250,_,0x122d,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,
               (char *)CONCAT44(local_250._M_dataplus._M_p._4_4_,local_250._M_dataplus._M_p._0_4_),
               local_250._M_string_length);
    pcVar28 = "In the Vulkan environment, the OriginLowerLeft execution mode must not be used.";
    lVar25 = 0x4f;
  }
LAB_001e22dd:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar28,lVar25);
  puVar29 = (undefined1 *)
            CONCAT44(local_250._M_dataplus._M_p._4_4_,local_250._M_dataplus._M_p._0_4_);
  sVar27 = local_38;
LAB_001e22f4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar29 != &local_250.field_2) {
    operator_delete(puVar29,local_250.field_2._M_allocated_capacity + 1);
  }
LAB_001e2e3b:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  if (sVar27 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar27;
}

Assistant:

spv_result_t ModeSettingPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpEntryPoint:
      if (auto error = ValidateEntryPoint(_, inst)) return error;
      break;
    case spv::Op::OpExecutionMode:
    case spv::Op::OpExecutionModeId:
      if (auto error = ValidateExecutionMode(_, inst)) return error;
      break;
    case spv::Op::OpMemoryModel:
      if (auto error = ValidateMemoryModel(_, inst)) return error;
      break;
    default:
      break;
  }
  return SPV_SUCCESS;
}